

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O1

enable_if_t<_std::is_class<typename_std::decay_t<float_&>_>::value,_void>
pbrt::detail::stringPrintfRecursiveWithPrecision<float&,float>
          (string *s,char *fmt,string *nextFmt,int precision,float *v,float *args)

{
  int iVar1;
  undefined4 in_register_0000000c;
  string str;
  char *local_60;
  undefined8 local_58;
  char local_50;
  undefined7 uStack_4f;
  char *local_40;
  float *local_38;
  
  local_40 = fmt;
  local_38 = args;
  iVar1 = snprintf((char *)0x0,0,(nextFmt->_M_dataplus)._M_p,(double)*v,
                   CONCAT44(in_register_0000000c,precision));
  local_60 = &local_50;
  local_58 = 0;
  local_50 = '\0';
  std::__cxx11::string::resize((ulong)&local_60,(char)(iVar1 + 1));
  snprintf(local_60,(long)(iVar1 + 1),(nextFmt->_M_dataplus)._M_p,(double)*v,(ulong)(uint)precision)
  ;
  std::__cxx11::string::pop_back();
  std::__cxx11::string::_M_append((char *)s,(ulong)local_60);
  stringPrintfRecursive<float>(s,local_40,local_38);
  if (local_60 != &local_50) {
    operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
  }
  return;
}

Assistant:

inline typename std::enable_if_t<!std::is_class<typename std::decay_t<T>>::value, void>
stringPrintfRecursiveWithPrecision(std::string *s, const char *fmt,
                                   const std::string &nextFmt, int precision, T &&v,
                                   Args &&... args) {
    size_t size = snprintf(nullptr, 0, nextFmt.c_str(), precision, v) + 1;
    std::string str;
    str.resize(size);
    snprintf(&str[0], size, nextFmt.c_str(), precision, v);
    str.pop_back();  // remove trailing NUL
    *s += str;

    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}